

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<bool>::Matcher(Matcher<bool> *this,bool value)

{
  ComparisonBase<testing::internal::EqMatcher<bool>,_bool,_testing::internal::AnyEq> local_31;
  Matcher<bool> local_30;
  byte local_11;
  Matcher<bool> *pMStack_10;
  bool value_local;
  Matcher<bool> *this_local;
  
  local_11 = value;
  pMStack_10 = this;
  testing::internal::MatcherBase<bool>::MatcherBase(&this->super_MatcherBase<bool>);
  (this->super_MatcherBase<bool>).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_003cf078;
  local_31.rhs_ = (bool)Eq<bool>((bool)(local_11 & 1));
  Matcher<testing::internal::EqMatcher<bool>,void>(&local_30,(EqMatcher<bool> *)&local_31);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }